

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O1

Amap_Nod_t * Amap_LibCreateObj(Amap_Lib_t *p)

{
  int iVar1;
  uint uVar2;
  Amap_Nod_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  size_t __size;
  Amap_Nod_t *pAVar5;
  undefined8 *puVar6;
  void *pvVar7;
  void **ppvVar8;
  int iVar9;
  
  if (p->nNodes == p->nNodesAlloc) {
    __size = (long)p->nNodesAlloc * 0x30;
    if (p->pNodes == (Amap_Nod_t *)0x0) {
      pAVar5 = (Amap_Nod_t *)malloc(__size);
    }
    else {
      pAVar5 = (Amap_Nod_t *)realloc(p->pNodes,__size);
    }
    p->pNodes = pAVar5;
    p->nNodesAlloc = p->nNodesAlloc << 1;
  }
  iVar1 = p->nNodes;
  pAVar3 = p->pNodes;
  pAVar5 = pAVar3 + iVar1;
  *(undefined8 *)pAVar5 = 0;
  pAVar5->iFan2 = 0;
  pAVar5->Unused = 0;
  *(undefined4 *)&pAVar5->field_0xc = 0;
  pAVar3[iVar1].pSets = (Amap_Set_t *)0x0;
  iVar9 = p->nNodes;
  p->nNodes = iVar9 + 1;
  *(short *)(pAVar3 + iVar1) = (short)iVar9;
  pVVar4 = p->vRules;
  puVar6 = (undefined8 *)malloc(0x10);
  *puVar6 = 0x10;
  pvVar7 = malloc(0x40);
  puVar6[1] = pvVar7;
  uVar2 = pVVar4->nCap;
  if (pVVar4->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar8;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_0044da4c;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar8;
    }
    pVVar4->nCap = iVar9;
  }
LAB_0044da4c:
  iVar9 = pVVar4->nSize;
  pVVar4->nSize = iVar9 + 1;
  pVVar4->pArray[iVar9] = puVar6;
  pVVar4 = p->vRules;
  puVar6 = (undefined8 *)malloc(0x10);
  *puVar6 = 0x10;
  pvVar7 = malloc(0x40);
  puVar6[1] = pvVar7;
  uVar2 = pVVar4->nCap;
  if (pVVar4->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar8;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_0044daec;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar8;
    }
    pVVar4->nCap = iVar9;
  }
LAB_0044daec:
  iVar9 = pVVar4->nSize;
  pVVar4->nSize = iVar9 + 1;
  pVVar4->pArray[iVar9] = puVar6;
  pVVar4 = p->vRulesX;
  puVar6 = (undefined8 *)malloc(0x10);
  *puVar6 = 0x10;
  pvVar7 = malloc(0x40);
  puVar6[1] = pvVar7;
  uVar2 = pVVar4->nCap;
  if (pVVar4->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar8;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_0044db92;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar8;
    }
    pVVar4->nCap = iVar9;
  }
LAB_0044db92:
  iVar9 = pVVar4->nSize;
  pVVar4->nSize = iVar9 + 1;
  pVVar4->pArray[iVar9] = puVar6;
  pVVar4 = p->vRulesX;
  puVar6 = (undefined8 *)malloc(0x10);
  *puVar6 = 0x10;
  pvVar7 = malloc(0x40);
  puVar6[1] = pvVar7;
  uVar2 = pVVar4->nCap;
  if (pVVar4->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar8;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_0044dc39;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar8;
    }
    pVVar4->nCap = iVar9;
  }
LAB_0044dc39:
  iVar9 = pVVar4->nSize;
  pVVar4->nSize = iVar9 + 1;
  pVVar4->pArray[iVar9] = puVar6;
  return pAVar3 + iVar1;
}

Assistant:

Amap_Nod_t * Amap_LibCreateObj( Amap_Lib_t * p )
{
    Amap_Nod_t * pNode;
    if ( p->nNodes == p->nNodesAlloc )
    {
        p->pNodes = ABC_REALLOC( Amap_Nod_t, p->pNodes, 2*p->nNodesAlloc );
        p->nNodesAlloc *= 2;
    }
    pNode = Amap_LibNod( p, p->nNodes );
    memset( pNode, 0, sizeof(Amap_Nod_t) );
    pNode->Id = p->nNodes++;
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    return pNode;
}